

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-objdump.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  bool bVar1;
  Result result;
  reference ppcVar2;
  char *filename;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  ParseOptions(argc,argv);
  if (((((s_objdump_options.headers & 1U) == 0) && ((s_objdump_options.details & 1U) == 0)) &&
      ((s_objdump_options.disassemble & 1U) == 0)) && ((s_objdump_options.raw & 1U) == 0)) {
    fprintf(_stderr,"At least one of the following switches must be given:\n");
    fprintf(_stderr," -d/--disassemble\n");
    fprintf(_stderr," -h/--headers\n");
    fprintf(_stderr," -x/--details\n");
    fprintf(_stderr," -s/--full-contents\n");
    argv_local._4_4_ = 1;
  }
  else {
    __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(&s_infiles);
    filename = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(&s_infiles);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&filename), bVar1) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end1);
      result = dump_file(*ppcVar2);
      bVar1 = wabt::Failed(result);
      if (bVar1) {
        return 1;
      }
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end1);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);
  if (!s_objdump_options.headers && !s_objdump_options.details &&
      !s_objdump_options.disassemble && !s_objdump_options.raw) {
    fprintf(stderr, "At least one of the following switches must be given:\n");
    fprintf(stderr, " -d/--disassemble\n");
    fprintf(stderr, " -h/--headers\n");
    fprintf(stderr, " -x/--details\n");
    fprintf(stderr, " -s/--full-contents\n");
    return 1;
  }

  for (const char* filename : s_infiles) {
    if (Failed(dump_file(filename))) {
      return 1;
    }
  }

  return 0;
}